

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O3

void __thiscall
soplex::
SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  Verbosity VVar1;
  uint uVar2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar3;
  char cVar4;
  undefined8 uVar5;
  cpp_dec_float<50U,_int,_void> *pcVar6;
  undefined1 auVar7 [16];
  uint auVar8 [2];
  uint auVar9 [2];
  uint uVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  bool *pbVar14;
  undefined4 uVar15;
  ostream **ppoVar16;
  long lVar17;
  char cVar18;
  char *pcVar19;
  fpclass_type *pfVar20;
  SPxOut *pSVar21;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  Item *this_02;
  cpp_dec_float<50u,int,void> *this_03;
  cpp_dec_float<50U,_int,_void> *pcVar23;
  DataArray<int> *vecExp;
  DataArray<int> *vecExp_00;
  bool bVar24;
  Real a;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  colscale;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  rowscale;
  Verbosity old_verbosity_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  undefined1 local_798 [16];
  uint local_788;
  uint uStack_784;
  uint uStack_780;
  uint uStack_77c;
  uint local_778;
  undefined3 uStack_773;
  uint local_770;
  bool local_76c;
  undefined8 local_768;
  undefined1 local_758 [16];
  DLPSV *local_748;
  uint uStack_740;
  undefined3 uStack_73b;
  DLPSV *local_738;
  uint local_730;
  bool local_72c [4];
  undefined8 local_728;
  undefined1 local_718 [16];
  uint local_708;
  uint uStack_704;
  uint uStack_700;
  uint uStack_6fc;
  uint local_6f8 [3];
  bool local_6ec [4];
  undefined8 local_6e8;
  soplex *local_6e0;
  pointer local_6d8;
  pointer pnStack_6d0;
  pointer local_6c8;
  undefined5 uStack_6c0;
  undefined3 uStack_6bb;
  undefined5 local_6b8;
  undefined3 uStack_6b3;
  int local_6b0;
  undefined1 local_6ac;
  undefined8 local_6a8;
  undefined1 local_698 [16];
  uint local_688 [3];
  undefined3 uStack_67b;
  uint local_678;
  undefined3 uStack_673;
  int local_670;
  bool local_66c;
  undefined8 local_668;
  undefined1 local_660 [16];
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_650;
  undefined1 local_648 [16];
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_638;
  cpp_dec_float<50U,_int,_void> *local_630;
  undefined1 local_628 [16];
  DLPSV *local_618;
  undefined8 uStack_610;
  DLPSV *local_608;
  uint local_600;
  bool local_5fc;
  undefined8 local_5f8;
  double local_5e8;
  uint auStack_5e0 [2];
  uint local_5d8 [7];
  bool local_5bc;
  fpclass_type local_5b8;
  int32_t iStack_5b4;
  undefined1 local_5a8 [8];
  undefined8 uStack_5a0;
  DLPSV *local_598;
  uint auStack_590 [2];
  DLPSV *local_588;
  uint local_580;
  bool local_57c;
  fpclass_type local_578;
  uint uStack_574;
  double local_568;
  uint auStack_560 [2];
  uint local_558 [2];
  uint auStack_550 [2];
  uint local_548 [2];
  uint local_540;
  bool local_53c;
  undefined8 local_538;
  cpp_dec_float<50U,_int,_void> *local_530;
  cpp_dec_float<50U,_int,_void> *local_528;
  SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_520;
  cpp_dec_float<50U,_int,_void> local_518;
  cpp_dec_float<50U,_int,_void> local_4e0;
  undefined1 local_4a8 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_458;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_418;
  undefined8 uStack_400;
  undefined8 local_3f8;
  int local_3f0;
  undefined1 local_3ec;
  fpclass_type local_3e8;
  int32_t iStack_3e4;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_3d8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  int local_3b0;
  undefined1 local_3ac;
  fpclass_type local_3a8;
  int32_t iStack_3a4;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_398;
  undefined8 uStack_380;
  undefined8 local_378;
  int local_370;
  undefined1 local_36c;
  fpclass_type local_368;
  int32_t iStack_364;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_358;
  undefined8 uStack_340;
  undefined8 local_338;
  int local_330;
  undefined1 local_32c;
  fpclass_type local_328;
  int32_t iStack_324;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_270;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_200;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_190;
  pointer local_158;
  pointer pnStack_150;
  pointer local_148;
  uint auStack_140 [2];
  uint local_138 [2];
  int local_130;
  bool local_12c;
  fpclass_type local_128;
  int32_t iStack_124;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  pSVar21 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  if ((pSVar21 != (SPxOut *)0x0) && (2 < (int)pSVar21->m_verbosity)) {
    local_518.data._M_elems[0] = 3;
    local_4e0.data._M_elems[0] = pSVar21->m_verbosity;
    (*pSVar21->_vptr_SPxOut[2])();
    pSVar21 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar21->m_streams[pSVar21->m_verbosity],"Geometric scaling LP",0x14);
    pcVar19 = " (persistent)";
    if (!persistent) {
      pcVar19 = "";
    }
    lVar17 = 0xd;
    if (!persistent) {
      lVar17 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar21->m_streams[pSVar21->m_verbosity],pcVar19,lVar17);
    pcVar19 = " with post-equilibration";
    bVar24 = this->postequilibration == false;
    if (bVar24) {
      pcVar19 = "";
    }
    lVar17 = 0x18;
    if (bVar24) {
      lVar17 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar21->m_streams[pSVar21->m_verbosity],pcVar19,lVar17);
    cVar18 = (char)pSVar21->m_streams[pSVar21->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar21->m_streams[pSVar21->m_verbosity] + -0x18)
                    + cVar18);
    std::ostream::put(cVar18);
    std::ostream::flush();
    pSVar21 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    (*pSVar21->_vptr_SPxOut[2])(pSVar21,&local_4e0);
  }
  (**(this->
     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxScaler)(this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x33])(&local_4e0,this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x34])(&local_518,this,lp);
  this_00 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  local_6a8._0_4_ = cpp_dec_float_finite;
  local_6a8._4_4_ = 10;
  local_6d8 = (pointer)0x0;
  pnStack_6d0 = (pointer)0x0;
  local_6c8 = (pointer)0x0;
  uStack_6c0 = 0;
  uStack_6bb = 0;
  local_6b8 = 0;
  uStack_6b3 = 0;
  local_6b0 = 0;
  local_6ac = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_6d8,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  uVar10 = 0;
  if ((local_4e0.fpclass != cpp_dec_float_NaN) &&
     (uVar10 = 0, local_518.fpclass != cpp_dec_float_NaN)) {
    uVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_4e0,&local_518);
    uVar10 = uVar10 >> 0x1f;
  }
  local_598 = (DLPSV *)0x0;
  auStack_590[0] = 0;
  auStack_590[1] = 0;
  local_5a8._0_4_ = 0;
  local_5a8._4_4_ = 0;
  uStack_5a0._0_4_ = 0;
  uStack_5a0._4_4_ = 0;
  local_588 = (DLPSV *)0x0;
  local_5d8[4] = 0;
  local_5d8[5] = 0;
  local_5d8[0] = 0;
  local_5d8[1] = 0;
  local_5d8[2] = 0;
  local_5d8[3] = 0;
  cVar18 = (char)uVar10;
  bVar24 = cVar18 != '\0';
  pcVar23 = &local_4e0;
  pcVar6 = &local_518;
  if (bVar24) {
    pcVar23 = &local_518;
    pcVar6 = &local_4e0;
  }
  local_5a8 = (undefined1  [8])*(Item **)(pcVar6->data)._M_elems;
  uStack_5a0 = *(DLPSV **)((pcVar6->data)._M_elems + 2);
  local_598 = *(DLPSV **)((pcVar6->data)._M_elems + 4);
  auStack_590 = (uint  [2])*(undefined8 *)((pcVar6->data)._M_elems + 6);
  local_588 = *(DLPSV **)((pcVar6->data)._M_elems + 8);
  local_580 = pcVar6->exp;
  ppoVar16 = (ostream **)(ulong)local_580;
  local_57c = pcVar6->neg;
  pfVar20 = &local_518.fpclass;
  if (bVar24) {
    pfVar20 = &local_4e0.fpclass;
  }
  local_578 = *pfVar20;
  uStack_574 = pcVar6->prec_elem;
  pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(ulong)uStack_574;
  local_5e8 = *(double *)(pcVar23->data)._M_elems;
  auStack_5e0 = (uint  [2])*(undefined8 *)((pcVar23->data)._M_elems + 2);
  local_5d8._0_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
  local_5d8._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 6);
  local_5d8._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 8);
  local_5d8[6] = pcVar23->exp;
  local_5bc = pcVar23->neg;
  pfVar20 = &local_4e0.fpclass;
  if (bVar24) {
    pfVar20 = &local_518.fpclass;
  }
  local_5b8 = *pfVar20;
  iStack_5b4 = pcVar23->prec_elem;
  pSVar21 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  if (pSVar21 != (SPxOut *)0x0) {
    VVar1 = pSVar21->m_verbosity;
    ppoVar16 = (ostream **)(ulong)VVar1;
    if (3 < (int)VVar1) {
      local_758._0_4_ = VVar1;
      local_718._0_4_ = 4;
      (*pSVar21->_vptr_SPxOut[2])();
      pSVar21 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity],"before scaling:",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity]," min= ",6);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[3])(&local_68,lp,1);
      boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_68);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity]," max= ",6);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[4])(&local_a0,lp,1);
      boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity]," col-ratio= ",0xc);
      local_d8.m_backend.data._M_elems[1] = local_4e0.data._M_elems[1];
      local_d8.m_backend.data._M_elems[0] = local_4e0.data._M_elems[0];
      local_d8.m_backend.data._M_elems[2] = local_4e0.data._M_elems[2];
      local_d8.m_backend.data._M_elems[3] = local_4e0.data._M_elems[3];
      local_d8.m_backend.data._M_elems[4] = local_4e0.data._M_elems[4];
      local_d8.m_backend.data._M_elems[5] = local_4e0.data._M_elems[5];
      local_d8.m_backend.data._M_elems[6] = local_4e0.data._M_elems[6];
      local_d8.m_backend.data._M_elems[7] = local_4e0.data._M_elems[7];
      local_d8.m_backend.data._M_elems[8] = local_4e0.data._M_elems[8];
      local_d8.m_backend.data._M_elems[9] = local_4e0.data._M_elems[9];
      local_d8.m_backend.exp = local_4e0.exp;
      local_d8.m_backend.neg = local_4e0.neg;
      boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_d8);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity]," row-ratio= ",0xc);
      local_118.m_backend.data._M_elems[1] = local_518.data._M_elems[1];
      local_118.m_backend.data._M_elems[0] = local_518.data._M_elems[0];
      local_118.m_backend.data._M_elems[2] = local_518.data._M_elems[2];
      local_118.m_backend.data._M_elems[3] = local_518.data._M_elems[3];
      local_118.m_backend.data._M_elems[4] = local_518.data._M_elems[4];
      local_118.m_backend.data._M_elems[5] = local_518.data._M_elems[5];
      local_118.m_backend.data._M_elems[6] = local_518.data._M_elems[6];
      local_118.m_backend.data._M_elems[7] = local_518.data._M_elems[7];
      local_118.m_backend.data._M_elems[8] = local_518.data._M_elems[8];
      local_118.m_backend.data._M_elems[9] = local_518.data._M_elems[9];
      local_118.m_backend.exp = local_518.exp;
      local_118.m_backend.neg = local_518.neg;
      boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_118);
      ppoVar16 = pSVar21->m_streams;
      cVar4 = (char)ppoVar16[pSVar21->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)ppoVar16[pSVar21->m_verbosity] + -0x18) + cVar4
                     );
      std::ostream::put(cVar4);
      std::ostream::flush();
      pSVar21 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar21->_vptr_SPxOut[2])(pSVar21,local_758);
    }
  }
  if ((local_5b8 == cpp_dec_float_NaN) ||
     ((this->m_goodEnoughRatio).m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_002c9adf:
    pSVar21 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar21 != (SPxOut *)0x0) && (3 < (int)pSVar21->m_verbosity)) {
      local_758._0_4_ = pSVar21->m_verbosity;
      local_718._0_4_ = 4;
      (*pSVar21->_vptr_SPxOut[2])();
      pSVar21 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity],
                 "No geometric scaling done, ratio good enough",0x2c);
      cVar4 = (char)pSVar21->m_streams[pSVar21->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar21->m_streams[pSVar21->m_verbosity] + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      pSVar21 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar21->_vptr_SPxOut[2])(pSVar21,local_758);
    }
    if (this->postequilibration == false) {
      lp->_isScaled = true;
      return;
    }
    pSVar21 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar21 != (SPxOut *)0x0) && (3 < (int)pSVar21->m_verbosity)) {
      local_758._0_4_ = pSVar21->m_verbosity;
      local_718._0_4_ = 4;
      (*pSVar21->_vptr_SPxOut[2])();
      pSVar21 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity],
                 " ... but will still perform equilibrium scaling",0x2f);
      cVar4 = (char)pSVar21->m_streams[pSVar21->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar21->m_streams[pSVar21->m_verbosity] + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      pSVar21 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar21->_vptr_SPxOut[2])(pSVar21,local_758);
    }
    uVar15 = 0;
  }
  else {
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)&local_5e8,
                        &(this->m_goodEnoughRatio).m_backend);
    uVar15 = (undefined4)CONCAT71((int7)((ulong)ppoVar16 >> 8),1);
    if (iVar11 < 1) goto LAB_002c9adf;
  }
  local_6e0 = (soplex *)CONCAT44(local_6e0._4_4_,uVar15);
  uVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_728._0_4_ = cpp_dec_float_finite;
  local_728._4_4_ = 10;
  local_758 = (undefined1  [16])0x0;
  local_748 = (DLPSV *)0x0;
  _uStack_740 = 0;
  uStack_73b = 0;
  local_738 = (DLPSV *)0x0;
  local_730 = 0;
  local_72c[0] = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_758,1.0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)local_648,(ulong)uVar2,(value_type *)local_758,(allocator_type *)local_718);
  uVar2 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_728._0_4_ = cpp_dec_float_finite;
  local_728._4_4_ = 10;
  local_758 = (undefined1  [16])0x0;
  local_748 = (DLPSV *)0x0;
  _uStack_740 = 0;
  uStack_73b = 0;
  local_738 = (DLPSV *)0x0;
  local_730 = 0;
  local_72c[0] = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_758,1.0);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)local_660,(ulong)uVar2,(value_type *)local_758,(allocator_type *)local_718);
  local_728._0_1_ = false;
  local_728._1_7_ = 0xa000000;
  local_758 = (undefined1  [16])0x0;
  local_748 = (DLPSV *)0x0;
  _uStack_740 = 0;
  uStack_73b = 0;
  local_738 = (DLPSV *)0x0;
  local_730 = 0;
  local_72c[0] = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_758,0.0);
  local_6e8._0_1_ = false;
  local_6e8._1_7_ = 0xa000000;
  local_718 = (undefined1  [16])0x0;
  local_708 = 0;
  uStack_704 = 0;
  uStack_700 = 0;
  uStack_6fc = 0;
  local_6f8[0] = 0;
  local_6f8[1] = 0;
  local_6f8[2] = 0;
  local_6ec[0] = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_718,0.0);
  if ((char)local_6e0 == '\0') {
LAB_002ca6e3:
    bVar24 = this->postequilibration == false;
    if (bVar24) {
      pSVar21 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      if ((pSVar21 != (SPxOut *)0x0) && (3 < (int)pSVar21->m_verbosity)) {
        local_628._0_4_ = pSVar21->m_verbosity;
        local_568 = (double)CONCAT44(local_568._4_4_,4);
        (*pSVar21->_vptr_SPxOut[2])();
        pSVar21 = (this->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar21->m_streams[pSVar21->m_verbosity],"No geometric scaling done.",0x1a);
        cVar18 = (char)pSVar21->m_streams[pSVar21->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar21->m_streams[pSVar21->m_verbosity] + -0x18) + cVar18)
        ;
        std::ostream::put(cVar18);
        std::ostream::flush();
        pSVar21 = (this->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        (*pSVar21->_vptr_SPxOut[2])(pSVar21,local_628);
      }
      lp->_isScaled = true;
      goto LAB_002cac7f;
    }
    vecExp_00 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_activeColscaleExp;
    vecExp = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeRowscaleExp;
    this_02 = (Item *)local_648._0_8_;
    if (!bVar24) {
      for (; this_03 = (cpp_dec_float<50u,int,void> *)local_660._0_8_,
          this_02 != (Item *)local_648._8_8_; this_02 = (Item *)&this_02[1].data.thenext) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)this_02,1.0);
      }
      for (; this_03 != (cpp_dec_float<50u,int,void> *)local_660._8_8_; this_03 = this_03 + 0x38) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(this_03,1.0);
      }
      goto LAB_002ca825;
    }
LAB_002ca8ad:
    SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::computeExpVec(&this->
                     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,(vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_660,vecExp_00);
    SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::computeExpVec(&this->
                     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,(vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_648,vecExp);
  }
  else {
    local_608 = local_588;
    local_618 = local_598;
    uStack_610 = auStack_590;
    local_628._0_8_ = local_5a8;
    local_628._8_8_ = uStack_5a0;
    local_600 = local_580;
    local_5fc = local_57c;
    local_5f8._4_4_ = uStack_574;
    local_5f8._0_4_ = local_578;
    local_548[0] = local_5d8[4];
    local_548[1] = local_5d8[5];
    local_558[0] = local_5d8[0];
    local_558[1] = local_5d8[1];
    auStack_550[0] = local_5d8[2];
    auStack_550[1] = local_5d8[3];
    local_568 = local_5e8;
    auStack_560[0] = auStack_5e0[0];
    auStack_560[1] = auStack_5e0[1];
    local_540 = local_5d8[6];
    local_53c = local_5bc;
    local_538._4_4_ = iStack_5b4;
    local_538._0_4_ = local_5b8;
    if (0 < this->m_maxIterations) {
      local_528 = (cpp_dec_float<50U,_int,_void> *)local_718;
      if (cVar18 != '\0') {
        local_528 = (cpp_dec_float<50U,_int,_void> *)local_758;
      }
      local_6e0 = (soplex *)
                  &lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_530 = (cpp_dec_float<50U,_int,_void> *)local_758;
      if (cVar18 != '\0') {
        local_530 = (cpp_dec_float<50U,_int,_void> *)local_718;
      }
      local_630 = &(this->m_minImprovement).m_backend;
      iVar11 = 0;
      local_4a8._0_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
      local_4a8._4_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
      local_4a8._8_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
      local_4a8._12_4_ = 0;
      auVar8 = auStack_560;
      auVar9 = local_548;
      local_520 = this;
      do {
        local_548 = auVar9;
        auStack_560 = auVar8;
        if (cVar18 == '\0') {
          uStack_3c0 = CONCAT35(uStack_6bb,uStack_6c0);
          local_3d8.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_6d8;
          local_3d8.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pnStack_6d0;
          local_3d8.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_6c8;
          local_3b8 = CONCAT35(uStack_6b3,local_6b8);
          local_3b0 = local_6b0;
          local_3ac = local_6ac;
          local_3a8 = (fpclass_type)local_6a8;
          iStack_3a4 = local_6a8._4_4_;
          computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_798,(soplex *)lp,
                     (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_660,
                     (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_648,&local_3d8,pnVar22);
          local_738 = (DLPSV *)CONCAT35(uStack_773,_local_778);
          local_748 = (DLPSV *)CONCAT44(uStack_784,local_788);
          _uStack_740 = (undefined5)CONCAT44(uStack_77c,uStack_780);
          uStack_73b = (undefined3)(uStack_77c >> 8);
          local_758 = local_798;
          local_730 = local_770;
          local_72c[0] = local_76c;
          local_728._0_1_ = local_768._0_1_;
          local_728._1_7_ = local_768._1_7_;
          uStack_400 = CONCAT35(uStack_6bb,uStack_6c0);
          local_418.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_6d8;
          local_418.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pnStack_6d0;
          local_418.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_6c8;
          local_3f8 = CONCAT35(uStack_6b3,local_6b8);
          local_3f0 = local_6b0;
          local_3ec = local_6ac;
          local_3e8 = (fpclass_type)local_6a8;
          iStack_3e4 = local_6a8._4_4_;
          computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_798,local_6e0,
                     (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_648,
                     (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_660,&local_418,pnVar22);
        }
        else {
          uStack_340 = CONCAT35(uStack_6bb,uStack_6c0);
          local_358.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_6d8;
          local_358.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pnStack_6d0;
          local_358.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_6c8;
          local_338 = CONCAT35(uStack_6b3,local_6b8);
          local_330 = local_6b0;
          local_32c = local_6ac;
          local_328 = (fpclass_type)local_6a8;
          iStack_324 = local_6a8._4_4_;
          computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_798,local_6e0,
                     (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_648,
                     (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_660,&local_358,pnVar22);
          local_738 = (DLPSV *)CONCAT35(uStack_773,_local_778);
          local_748 = (DLPSV *)CONCAT44(uStack_784,local_788);
          _uStack_740 = (undefined5)CONCAT44(uStack_77c,uStack_780);
          uStack_73b = (undefined3)(uStack_77c >> 8);
          local_758 = local_798;
          local_730 = local_770;
          local_72c[0] = local_76c;
          local_728._0_1_ = local_768._0_1_;
          local_728._1_7_ = local_768._1_7_;
          uStack_380 = CONCAT35(uStack_6bb,uStack_6c0);
          local_398.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_6d8;
          local_398.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pnStack_6d0;
          local_398.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_6c8;
          local_378 = CONCAT35(uStack_6b3,local_6b8);
          local_370 = local_6b0;
          local_36c = local_6ac;
          local_368 = (fpclass_type)local_6a8;
          iStack_364 = local_6a8._4_4_;
          computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_798,(soplex *)lp,
                     (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_660,
                     (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)local_648,&local_398,pnVar22);
        }
        this = local_520;
        pcVar6 = local_630;
        local_6f8[1]._1_3_ = uStack_773;
        local_6f8._0_5_ = _local_778;
        local_708 = local_788;
        uStack_704 = uStack_784;
        uStack_700 = uStack_780;
        uStack_6fc = uStack_77c;
        local_718 = local_798;
        local_6f8[2] = local_770;
        local_6ec[0] = local_76c;
        local_6e8._0_1_ = local_768._0_1_;
        local_6e8._1_7_ = local_768._1_7_;
        pSVar21 = (local_520->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        if ((pSVar21 != (SPxOut *)0x0) && (4 < (int)pSVar21->m_verbosity)) {
          local_798._0_4_ = pSVar21->m_verbosity;
          local_698._0_4_ = 5;
          (*pSVar21->_vptr_SPxOut[2])(pSVar21,(cpp_dec_float<50U,_int,_void> *)local_698);
          pSVar21 = (this->
                    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar21->m_streams[pSVar21->m_verbosity],"Geometric scaling round ",0x18);
          std::ostream::operator<<((ostream *)pSVar21->m_streams[pSVar21->m_verbosity],iVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar21->m_streams[pSVar21->m_verbosity]," col-ratio= ",0xc);
          local_458.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_528->data)._M_elems + 8)
          ;
          local_458.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_528->data)._M_elems + 4)
          ;
          local_458.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_528->data)._M_elems + 6)
          ;
          local_458.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_528->data;
          local_458.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_528->data)._M_elems + 2);
          piVar13 = &((cpp_dec_float<50U,_int,_void> *)local_718)->exp;
          if (cVar18 != '\0') {
            piVar13 = (int *)&local_730;
          }
          local_458.m_backend.exp = *piVar13;
          pbVar14 = &((cpp_dec_float<50U,_int,_void> *)local_718)->neg;
          if (cVar18 != '\0') {
            pbVar14 = local_72c;
          }
          local_458.m_backend.neg = *pbVar14;
          local_458.m_backend._48_8_ =
               CONCAT44(SUB84(local_728,4) & local_4a8._4_4_,
                        (fpclass_type)local_728 & local_4a8._0_4_) |
               CONCAT44(~local_4a8._4_4_ & SUB84(local_6e8,4),
                        ~local_4a8._0_4_ & (fpclass_type)local_6e8);
          boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_458);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar21->m_streams[pSVar21->m_verbosity]," row-ratio= ",0xc);
          local_498.m_backend.data._M_elems._32_8_ = *(undefined8 *)((local_530->data)._M_elems + 8)
          ;
          local_498.m_backend.data._M_elems._16_8_ = *(undefined8 *)((local_530->data)._M_elems + 4)
          ;
          local_498.m_backend.data._M_elems._24_8_ = *(undefined8 *)((local_530->data)._M_elems + 6)
          ;
          local_498.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_530->data;
          local_498.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_530->data)._M_elems + 2);
          piVar13 = (int *)&local_730;
          if (cVar18 != '\0') {
            piVar13 = &((cpp_dec_float<50U,_int,_void> *)local_718)->exp;
          }
          local_498.m_backend.exp = *piVar13;
          pbVar14 = local_72c;
          if (cVar18 != '\0') {
            pbVar14 = &((cpp_dec_float<50U,_int,_void> *)local_718)->neg;
          }
          local_498.m_backend.neg = *pbVar14;
          local_498.m_backend._48_8_ =
               CONCAT44(SUB84(local_6e8,4) & local_4a8._4_4_,
                        (fpclass_type)local_6e8 & local_4a8._0_4_) |
               CONCAT44(~local_4a8._4_4_ & SUB84(local_728,4),
                        ~local_4a8._0_4_ & (fpclass_type)local_728);
          boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_498);
          cVar4 = (char)pSVar21->m_streams[pSVar21->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar21->m_streams[pSVar21->m_verbosity] + -0x18) + cVar4
                         );
          std::ostream::put(cVar4);
          std::ostream::flush();
          pSVar21 = (this->
                    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar21->_vptr_SPxOut[2])(pSVar21,(cpp_dec_float<50U,_int,_void> *)local_798);
        }
        local_768._0_1_ = false;
        local_768._1_7_ = 0xa000000;
        local_798 = ZEXT816(0);
        local_788 = 0;
        uStack_784 = 0;
        uStack_780 = 0;
        uStack_77c = 0;
        _local_778 = 0;
        uStack_773 = 0;
        local_770 = 0;
        local_76c = false;
        if ((cpp_dec_float<50U,_int,_void> *)local_798 != pcVar6) {
          uVar3 = *(undefined8 *)((pcVar6->data)._M_elems + 8);
          _local_778 = (undefined5)uVar3;
          uStack_773 = (undefined3)((ulong)uVar3 >> 0x28);
          local_798 = *(undefined1 (*) [16])(pcVar6->data)._M_elems;
          uVar3 = *(undefined8 *)((pcVar6->data)._M_elems + 4);
          uVar5 = *(undefined8 *)((pcVar6->data)._M_elems + 6);
          local_788 = (uint)uVar3;
          uStack_784 = (uint)((ulong)uVar3 >> 0x20);
          uStack_780 = (uint)uVar5;
          uStack_77c = (uint)((ulong)uVar5 >> 0x20);
          local_770 = (this->m_minImprovement).m_backend.exp;
          local_76c = (this->m_minImprovement).m_backend.neg;
          local_768 = *(undefined8 *)&(this->m_minImprovement).m_backend.fpclass;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  ((cpp_dec_float<50U,_int,_void> *)local_798,
                   (cpp_dec_float<50U,_int,_void> *)local_628);
        if ((((fpclass_type)local_728 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_768 != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_758,
                                (cpp_dec_float<50U,_int,_void> *)local_798), 0 < iVar12)) {
          local_668._0_4_ = cpp_dec_float_finite;
          local_668._4_4_ = 10;
          local_698 = ZEXT816(0);
          local_688[0] = 0;
          local_688[1] = 0;
          stack0xfffffffffffff980 = 0;
          uStack_67b = 0;
          _local_678 = 0;
          uStack_673 = 0;
          local_670 = 0;
          local_66c = false;
          if ((cpp_dec_float<50U,_int,_void> *)local_698 != pcVar6) {
            uVar3 = *(undefined8 *)((pcVar6->data)._M_elems + 8);
            _local_678 = (undefined5)uVar3;
            uStack_673 = (undefined3)((ulong)uVar3 >> 0x28);
            local_698 = *(undefined1 (*) [16])(pcVar6->data)._M_elems;
            local_688._0_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar6->data)._M_elems + 6);
            stack0xfffffffffffff980 = (undefined5)uVar3;
            uStack_67b = (undefined3)((ulong)uVar3 >> 0x28);
            local_670 = (this->m_minImprovement).m_backend.exp;
            local_66c = (this->m_minImprovement).m_backend.neg;
            local_668._0_4_ = (this->m_minImprovement).m_backend.fpclass;
            local_668._4_4_ = (this->m_minImprovement).m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)local_698,
                     (cpp_dec_float<50U,_int,_void> *)&local_568);
          if ((((fpclass_type)local_6e8 != cpp_dec_float_NaN) &&
              ((fpclass_type)local_668 != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_718,
                                  (cpp_dec_float<50U,_int,_void> *)local_698), 0 < iVar12)) break;
        }
        auVar7 = local_718;
        local_608 = local_738;
        local_628._0_8_ = local_758._0_8_;
        local_628._8_8_ = local_758._8_8_;
        local_618 = local_748;
        uStack_610._5_3_ = uStack_73b;
        uStack_610._0_5_ = _uStack_740;
        local_600 = local_730;
        local_5fc = local_72c[0];
        local_5f8._0_1_ = local_728._0_1_;
        local_5f8._1_7_ = local_728._1_7_;
        local_568 = (double)local_718._0_8_;
        auVar8[0] = local_718._8_4_;
        auVar8[1] = local_718._12_4_;
        local_558[1] = uStack_704;
        local_558[0] = local_708;
        auStack_550[1] = uStack_6fc;
        auStack_550[0] = uStack_700;
        auStack_560[0] = local_718._8_4_;
        auStack_560[1] = local_718._12_4_;
        auVar9[0] = local_6f8[0];
        auVar9[1] = local_6f8[1];
        local_548[0] = local_6f8[0];
        local_548[1] = local_6f8[1];
        local_540 = local_6f8[2];
        local_53c = local_6ec[0];
        local_538._0_1_ = local_6e8._0_1_;
        local_538._1_7_ = local_6e8._1_7_;
        iVar11 = iVar11 + 1;
        local_718 = auVar7;
      } while (iVar11 < this->m_maxIterations);
    }
    pnVar22 = &this->m_minImprovement;
    local_768._0_1_ = false;
    local_768._1_7_ = 0xa000000;
    local_798 = (undefined1  [16])0x0;
    local_788 = 0;
    uStack_784 = 0;
    uStack_780 = 0;
    uStack_77c = 0;
    _local_778 = 0;
    uStack_773 = 0;
    local_770 = 0;
    local_76c = false;
    if ((cpp_dec_float<50U,_int,_void> *)local_798 != &pnVar22->m_backend) {
      uVar3 = *(undefined8 *)((this->m_minImprovement).m_backend.data._M_elems + 8);
      _local_778 = (undefined5)uVar3;
      uStack_773 = (undefined3)((ulong)uVar3 >> 0x28);
      local_798 = *(undefined1 (*) [16])(pnVar22->m_backend).data._M_elems;
      uVar3 = *(undefined8 *)((this->m_minImprovement).m_backend.data._M_elems + 4);
      uVar5 = *(undefined8 *)((this->m_minImprovement).m_backend.data._M_elems + 6);
      local_788 = (uint)uVar3;
      uStack_784 = (uint)((ulong)uVar3 >> 0x20);
      uStack_780 = (uint)uVar5;
      uStack_77c = (uint)((ulong)uVar5 >> 0x20);
      local_770 = (this->m_minImprovement).m_backend.exp;
      local_76c = (this->m_minImprovement).m_backend.neg;
      local_768 = *(undefined8 *)&(this->m_minImprovement).m_backend.fpclass;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              ((cpp_dec_float<50U,_int,_void> *)local_798,(cpp_dec_float<50U,_int,_void> *)local_5a8
              );
    if ((((fpclass_type)local_728 == cpp_dec_float_NaN) ||
        ((fpclass_type)local_768 == cpp_dec_float_NaN)) ||
       (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_758,
                            (cpp_dec_float<50U,_int,_void> *)local_798), 0 < iVar11)) {
      local_668._0_4_ = cpp_dec_float_finite;
      local_668._4_4_ = 10;
      local_698 = (undefined1  [16])0x0;
      local_688[0] = 0;
      local_688[1] = 0;
      stack0xfffffffffffff980 = 0;
      uStack_67b = 0;
      _local_678 = 0;
      uStack_673 = 0;
      local_670 = 0;
      local_66c = false;
      if ((cpp_dec_float<50U,_int,_void> *)local_698 != &pnVar22->m_backend) {
        uVar3 = *(undefined8 *)((this->m_minImprovement).m_backend.data._M_elems + 8);
        _local_678 = (undefined5)uVar3;
        uStack_673 = (undefined3)((ulong)uVar3 >> 0x28);
        local_698 = *(undefined1 (*) [16])(pnVar22->m_backend).data._M_elems;
        local_688._0_8_ = *(undefined8 *)((this->m_minImprovement).m_backend.data._M_elems + 4);
        uVar3 = *(undefined8 *)((this->m_minImprovement).m_backend.data._M_elems + 6);
        stack0xfffffffffffff980 = (undefined5)uVar3;
        uStack_67b = (undefined3)((ulong)uVar3 >> 0x28);
        local_670 = (this->m_minImprovement).m_backend.exp;
        local_66c = (this->m_minImprovement).m_backend.neg;
        local_668._0_4_ = (this->m_minImprovement).m_backend.fpclass;
        local_668._4_4_ = (this->m_minImprovement).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                ((cpp_dec_float<50U,_int,_void> *)local_698,
                 (cpp_dec_float<50U,_int,_void> *)&local_5e8);
      if ((((fpclass_type)local_6e8 == cpp_dec_float_NaN) ||
          ((fpclass_type)local_668 == cpp_dec_float_NaN)) ||
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_718,
                              (cpp_dec_float<50U,_int,_void> *)local_698), 0 < iVar11))
      goto LAB_002ca6e3;
      vecExp_00 = (this->
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_activeColscaleExp;
      vecExp = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_activeRowscaleExp;
      if ((this->postequilibration & 1U) != 0) goto LAB_002ca825;
      goto LAB_002ca8ad;
    }
    vecExp_00 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_activeColscaleExp;
    vecExp = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeRowscaleExp;
    if (this->postequilibration == false) goto LAB_002ca8ad;
LAB_002ca825:
    local_138[1]._1_3_ = uStack_6b3;
    local_138._0_5_ = local_6b8;
    auStack_140[1]._1_3_ = uStack_6bb;
    auStack_140._0_5_ = uStack_6c0;
    local_148 = local_6c8;
    local_158 = local_6d8;
    pnStack_150 = pnStack_6d0;
    local_130 = local_6b0;
    local_12c = (bool)local_6ac;
    local_128 = (fpclass_type)local_6a8;
    iStack_124 = local_6a8._4_4_;
    SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::computePostequiExpVecs
              (lp,(vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   *)local_648,
               (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)local_660,vecExp,vecExp_00,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_158);
  }
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[2])(this,lp);
  pSVar21 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  if (pSVar21 != (SPxOut *)0x0) {
    if (4 < (int)pSVar21->m_verbosity) {
      local_628._0_4_ = pSVar21->m_verbosity;
      local_568 = (double)CONCAT44(local_568._4_4_,5);
      (*pSVar21->_vptr_SPxOut[2])();
      pSVar21 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity],"Row scaling min= ",0x11);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x31])(&local_190,this);
      boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity]," max= ",6);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x32])(&local_1c8,this);
      boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_1c8);
      cVar18 = (char)pSVar21->m_streams[pSVar21->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar21->m_streams[pSVar21->m_verbosity] + -0x18) + cVar18);
      std::ostream::put(cVar18);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity],"IGEOSC06 Col scaling min= ",0x1a);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x2f])(&local_200,this);
      boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_200);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity]," max= ",6);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x30])(&local_238,this);
      boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_238);
      cVar18 = (char)pSVar21->m_streams[pSVar21->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar21->m_streams[pSVar21->m_verbosity] + -0x18) + cVar18);
      std::ostream::put(cVar18);
      std::ostream::flush();
      pSVar21 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar21->_vptr_SPxOut[2])(pSVar21,local_628);
      pSVar21 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      if (pSVar21 == (SPxOut *)0x0) goto LAB_002cac7f;
    }
    if (3 < (int)pSVar21->m_verbosity) {
      local_628._0_4_ = pSVar21->m_verbosity;
      local_568 = (double)CONCAT44(local_568._4_4_,4);
      (*pSVar21->_vptr_SPxOut[2])();
      pSVar21 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity],"after scaling: ",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity]," min= ",6);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[3])(&local_270,lp,0);
      boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_270);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity]," max= ",6);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[4])(&local_2a8,lp,0);
      boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_2a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity]," col-ratio= ",0xc);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x33])(&local_2e0,this,lp);
      boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_2e0);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar21->m_streams[pSVar21->m_verbosity]," row-ratio= ",0xc);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x34])(&local_318,this,lp);
      boost::multiprecision::operator<<(pSVar21->m_streams[pSVar21->m_verbosity],&local_318);
      cVar18 = (char)pSVar21->m_streams[pSVar21->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar21->m_streams[pSVar21->m_verbosity] + -0x18) + cVar18);
      std::ostream::put(cVar18);
      std::ostream::flush();
      pSVar21 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar21->_vptr_SPxOut[2])(pSVar21,local_628);
    }
  }
LAB_002cac7f:
  if ((cpp_dec_float<50u,int,void> *)local_660._0_8_ != (cpp_dec_float<50u,int,void> *)0x0) {
    operator_delete((void *)local_660._0_8_,(long)local_650 - local_660._0_8_);
  }
  if ((Item *)local_648._0_8_ != (Item *)0x0) {
    operator_delete((void *)local_648._0_8_,(long)local_638 - local_648._0_8_);
  }
  return;
}

Assistant:

void SPxGeometSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Geometric scaling LP" <<
                 (persistent ? " (persistent)" : "") << (postequilibration ? " with post-equilibration" : "") <<
                 std::endl;)

   this->setup(lp);

   /* We want to do that direction first, with the lower ratio.
    * See SPxEquiliSC<R>::scale() for a reasoning.
    */
   const R colratio = this->maxColRatio(lp);
   const R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   const bool colFirst = colratio < rowratio;

   R p0start;
   R p1start;

   if(colFirst)
   {
      p0start = colratio;
      p1start = rowratio;
   }
   else
   {
      p0start = rowratio;
      p1start = colratio;
   }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   // perform geometric scaling only if maximum ratio is above threshold
   bool geoscale = p1start > m_goodEnoughRatio;

   if(!geoscale)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done, ratio good enough" <<
                    std::endl;)

      if(!postequilibration)
      {
         lp.setScalingInfo(true);
         return;
      }

      SPX_MSG_INFO2((*this->spxout),
                    (*this->spxout) << " ... but will still perform equilibrium scaling" <<
                    std::endl;)
   }

   std::vector<R> rowscale(unsigned(lp.nRows()), 1.0);
   std::vector<R> colscale(unsigned(lp.nCols()), 1.0);

   R p0 = 0.0;
   R p1 = 0.0;

   if(geoscale)
   {
      R p0prev = p0start;
      R p1prev = p1start;

      // we make at most maxIterations.
      for(int count = 0; count < m_maxIterations; count++)
      {
         if(colFirst)
         {
            p0 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
            p1 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
         }
         else
         {
            p0 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
            p1 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
         }

         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Geometric scaling round " << count
                       << " col-ratio= " << (colFirst ? p0 : p1)
                       << " row-ratio= " << (colFirst ? p1 : p0)
                       << std::endl;)

         if(p0 > m_minImprovement * p0prev && p1 > m_minImprovement * p1prev)
            break;

         p0prev = p0;
         p1prev = p1;
      }

      // perform geometric scaling only if there is enough (default 15%) improvement.
      geoscale = (p0 <= m_minImprovement * p0start || p1 <= m_minImprovement * p1start);
   }

   if(!geoscale && !postequilibration)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done." << std::endl;)
      lp.setScalingInfo(true);
   }
   else
   {
      DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
      DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

      if(postequilibration)
      {
         if(!geoscale)
         {
            std::fill(rowscale.begin(), rowscale.end(), 1.0);
            std::fill(colscale.begin(), colscale.end(), 1.0);
         }

         SPxEquiliSC<R>::computePostequiExpVecs(lp, rowscale, colscale, rowscaleExp, colscaleExp, epsilon);
      }
      else
      {
         this->computeExpVec(colscale, colscaleExp);
         this->computeExpVec(rowscale, rowscaleExp);
      }

      this->applyScaling(lp);

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                    << " max= " << this->maxAbsRowscale()
                    << std::endl
                    << "IGEOSC06 Col scaling min= " << this->minAbsColscale()
                    << " max= " << this->maxAbsColscale()
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                    << " min= " << lp.minAbsNzo(false)
                    << " max= " << lp.maxAbsNzo(false)
                    << " col-ratio= " << this->maxColRatio(lp)
                    << " row-ratio= " << this->maxRowRatio(lp)
                    << std::endl;)
   }
}